

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<2>_(bool)>::UntypedPerformAction
          (FunctionMockerBase<BasicTestExpr<2>_(bool)> *this,void *untyped_action,void *untyped_args
          )

{
  ActionResultHolder<BasicTestExpr<2>_> *pAVar1;
  Action<BasicTestExpr<2>_(bool)> action;
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_> local_20;
  
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>(bool)>>::
  copy<testing::ActionInterface<BasicTestExpr<2>(bool)>>
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<2>(bool)>> *)&local_20,
             (linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_> *)untyped_action);
  pAVar1 = ActionResultHolder<BasicTestExpr<2>>::PerformAction<BasicTestExpr<2>(bool)>
                     ((Action<BasicTestExpr<2>_(bool)> *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_>::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }